

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserAnimation.cpp
# Opt level: O0

bool __thiscall Rml::Keyword::ValidAnimation(Keyword *this)

{
  bool local_11;
  Keyword *this_local;
  
  local_11 = true;
  if ((((this->type != None) && (local_11 = true, this->type != Tween)) &&
      (local_11 = true, this->type != Alternate)) && (local_11 = true, this->type != Infinite)) {
    local_11 = this->type == Paused;
  }
  return local_11;
}

Assistant:

bool ValidAnimation() const
	{
		return type == KeywordType::None || type == KeywordType::Tween || type == KeywordType::Alternate || type == KeywordType::Infinite ||
			type == KeywordType::Paused;
	}